

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void aGLDraw(AGLDrawSource *src,AGLDrawMerge *merge,AGLDrawTarget *target)

{
  AGLDrawTarget *target_local;
  AGLDrawMerge *merge_local;
  AGLDrawSource *src_local;
  
  a__GLTargetBind(target);
  a__GLDepthBind(merge->depth);
  a__GLBlendBind(&merge->blend);
  a__GLProgramBind(src->program,(src->uniforms).p,(src->uniforms).n);
  a__GLAttribsBind((src->attribs).p,(src->attribs).n);
  a__GLCullingBind((src->primitive).cull_mode,(src->primitive).front_face);
  if (((src->primitive).index.buffer == (AGLBuffer *)0x0) &&
     ((src->primitive).index.data.ptr == (GLvoid *)0x0)) {
    glDrawArrays((src->primitive).mode,(src->primitive).first,(src->primitive).count);
  }
  else {
    if ((src->primitive).index.buffer == (AGLBuffer *)0x0) {
      glBindBuffer(0x8893,0);
    }
    else {
      glBindBuffer(0x8893,((src->primitive).index.buffer)->name);
    }
    glDrawElements((src->primitive).mode,(src->primitive).count,(src->primitive).index.type,
                   (src->primitive).index.data.ptr);
  }
  return;
}

Assistant:

void aGLDraw(const AGLDrawSource *src, const AGLDrawMerge *merge, const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLTargetBind(target);

	a__GLDepthBind(merge->depth);
	a__GLBlendBind(&merge->blend);

	a__GLProgramBind(src->program, src->uniforms.p, src->uniforms.n);
	a__GLAttribsBind(src->attribs.p, src->attribs.n);
	a__GLCullingBind(src->primitive.cull_mode, src->primitive.front_face);

	if (src->primitive.index.buffer || src->primitive.index.data.ptr) {
		if (src->primitive.index.buffer) {
			/* FIXME store binding in state */
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, src->primitive.index.buffer->name));
		} else {
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0));
		}

		AGL__CALL(glDrawElements(
			src->primitive.mode, src->primitive.count, src->primitive.index.type, src->primitive.index.data.ptr));
	} else
		AGL__CALL(glDrawArrays(src->primitive.mode, src->primitive.first, src->primitive.count));
	ATTO_GL_PROFILE_FUNC("aGLDraw", aAppTime() - start);
}